

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O0

void __thiscall
InlineeFrameRecord::RestoreFrames
          (InlineeFrameRecord *this,FunctionBody *functionBody,InlinedFrameLayout *outerMostFrame,
          JavascriptCallStackLayout *callstack,bool boxValues)

{
  InlinedFrameLayout *pIVar1;
  bool bVar2;
  uint local_68;
  int currentDepth;
  uint local_54;
  InlinedFrameLayout *pIStack_50;
  int inlineDepth;
  InlinedFrameLayout *currentFrame;
  InlineeFrameRecord *currentRecord;
  AutoReverse autoReverse;
  InlineeFrameRecord *innerMostRecord;
  bool boxValues_local;
  JavascriptCallStackLayout *callstack_local;
  InlinedFrameLayout *outerMostFrame_local;
  FunctionBody *functionBody_local;
  InlineeFrameRecord *this_local;
  
  autoReverse.record = this;
  RestoreFrames::AutoReverse::AutoReverse((AutoReverse *)&currentRecord,this);
  currentFrame = (InlinedFrameLayout *)currentRecord;
  local_54 = 1;
  for (pIStack_50 = outerMostFrame; ((ulong)pIStack_50->callInfo & 0xf) != 0;
      pIStack_50 = InlinedFrameLayout::Next(pIStack_50)) {
    local_54 = local_54 + 1;
  }
  while( true ) {
    bVar2 = false;
    if (currentFrame != (InlinedFrameLayout *)0x0) {
      bVar2 = (currentFrame->callInfo).InlineeStartOffset != local_54;
    }
    if (!bVar2) break;
    currentFrame = (InlinedFrameLayout *)currentFrame[1].function;
  }
  local_68 = local_54;
  if (currentFrame != (InlinedFrameLayout *)0x0) {
    while( true ) {
      bVar2 = false;
      if ((currentFrame != (InlinedFrameLayout *)0x0) &&
         (bVar2 = true, *(int *)&currentFrame[1].arguments == 0)) {
        bVar2 = currentFrame[1].function != (JavascriptFunction *)0x0;
      }
      if (!bVar2) break;
      if (*(int *)&currentFrame[1].arguments != 0) {
        Restore((InlineeFrameRecord *)currentFrame,functionBody,pIStack_50,callstack,boxValues);
      }
      currentFrame = (InlinedFrameLayout *)currentFrame[1].function;
      if ((JavascriptFunction *)currentFrame != (JavascriptFunction *)0x0) {
        for (; local_68 !=
               *(uint *)((long)&(((JavascriptFunction *)currentFrame)->super_DynamicObject).
                                super_RecyclableObject.super_FinalizableObject.
                                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4);
            local_68 = local_68 + 1) {
          pIStack_50 = InlinedFrameLayout::Next(pIStack_50);
        }
      }
    }
    if (currentFrame == (InlinedFrameLayout *)0x0) {
      pIVar1 = InlinedFrameLayout::Next(pIStack_50);
      *(uint *)&pIVar1->callInfo = *(uint *)&pIVar1->callInfo & 0xfffffff0;
    }
  }
  RestoreFrames::AutoReverse::~AutoReverse((AutoReverse *)&currentRecord);
  return;
}

Assistant:

void InlineeFrameRecord::RestoreFrames(Js::FunctionBody* functionBody, InlinedFrameLayout* outerMostFrame, Js::JavascriptCallStackLayout* callstack, bool boxValues)
{
    InlineeFrameRecord* innerMostRecord = this;
    class AutoReverse
    {
    public:
        InlineeFrameRecord* record;
        AutoReverse(InlineeFrameRecord* record)
        {
            this->record = record->Reverse();
        }

        ~AutoReverse()
        {
            record->Reverse();
        }
    } autoReverse(innerMostRecord);

    InlineeFrameRecord* currentRecord = autoReverse.record;
    InlinedFrameLayout* currentFrame = outerMostFrame;

    int inlineDepth = 1;

    // Find an inlined frame that needs to be restored.
    while (currentFrame->callInfo.Count != 0)
    {
        inlineDepth++;
        currentFrame = currentFrame->Next();
    }
    // Align the inline depth of the record with the frame that needs to be restored
    while (currentRecord && currentRecord->inlineDepth != inlineDepth)
    {
        currentRecord = currentRecord->parent;
    }
    int currentDepth = inlineDepth;

    // Return if there is nothing to restore
    if (!currentRecord)
    {
        return;
    }

    // We have InlineeFrameRecords for optimized frames and parents (i.e. inlinees) of optimized frames
    // InlineeFrameRecords for unoptimized frames don't have values to restore and have argCount 0
    while (currentRecord && (currentRecord->argCount != 0 || currentRecord->parent))
    {
        // There is nothing to restore for unoptimized frames
        if (currentRecord->argCount != 0)
        {
            currentRecord->Restore(functionBody, currentFrame, callstack, boxValues);
        }
        currentRecord = currentRecord->parent;

        // Walk stack frames forward to the depth of the next record
        if (currentRecord)
        {
            while (currentDepth != currentRecord->inlineDepth)
            {
                currentFrame = currentFrame->Next();
                currentDepth++;
            }
        }
    }
    
    // If we don't have any more InlineeFrameRecords, the innermost inlinee was an optimized frame
    if (!currentRecord)
    {
        // We determine the innermost inlinee by frame->Next()->callInfo.Count == 0
        // Optimized frames don't have this set when entering inlinee in the JITed code, so we must do
        // this for them now
        currentFrame->Next()->callInfo.Count = 0;
    }
}